

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O2

Regexp * __thiscall
re2::CoalesceWalker::ShortVisit(CoalesceWalker *this,Regexp *re,Regexp *parent_arg)

{
  Regexp *pRVar1;
  LogMessageFatal LStack_188;
  
  LogMessageFatal::LogMessageFatal
            (&LStack_188,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/simplify.cc",0xd3
            );
  std::operator<<((ostream *)&LStack_188.super_LogMessage.str_,"CoalesceWalker::ShortVisit called");
  LogMessageFatal::~LogMessageFatal(&LStack_188);
  pRVar1 = Regexp::Incref(re);
  return pRVar1;
}

Assistant:

Regexp* CoalesceWalker::ShortVisit(Regexp* re, Regexp* parent_arg) {
  // This should never be called, since we use Walk and not
  // WalkExponential.
  LOG(DFATAL) << "CoalesceWalker::ShortVisit called";
  return re->Incref();
}